

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O2

pair<unsigned_long,_unsigned_long> __thiscall
CppGenerator::addProductToLoop
          (CppGenerator *this,ProductAggregate *prodAgg,size_t *currentLoop,bool *loopsOverRelation,
          size_t *maxDepth)

{
  undefined8 *puVar1;
  size_t sVar2;
  pointer pbVar3;
  pointer pvVar4;
  pointer pmVar5;
  pointer pvVar6;
  pointer pvVar7;
  pointer pvVar8;
  long lVar9;
  unsigned_long uVar10;
  pointer pvVar11;
  pointer pAVar12;
  byte bVar13;
  pair<unsigned_long,_unsigned_long> pVar14;
  bool bVar15;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_t sVar16;
  iterator iVar17;
  mapped_type *pmVar18;
  size_type sVar19;
  iterator iVar20;
  mapped_type *pmVar21;
  iterator iVar22;
  mapped_type *pmVar23;
  mapped_type mVar24;
  pointer ppVar25;
  ulong uVar26;
  pair<unsigned_long,_unsigned_long> pVar27;
  pair<unsigned_long,_unsigned_long> pVar28;
  undefined1 local_218;
  dyn_bitset viewsForThisLoop;
  size_t nextLoop;
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  viewReg;
  prod_bitset loopFunctions;
  
  sVar2 = *currentLoop;
  this_00 = (this->listOfLoops).
            super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start + sVar2;
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&viewsForThisLoop,
             (this->viewsPerLoop).
             super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + sVar2);
  sVar16 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  *loopsOverRelation =
       (viewsForThisLoop.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start[sVar16 >> 6] >> (sVar16 & 0x3f) & 1) != 0;
  sVar16 = QueryCompiler::numberOfViews
                     ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  bVar13 = (byte)sVar16 & 0x3f;
  viewsForThisLoop.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar16 >> 6] =
       viewsForThisLoop.m_bits.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_start[sVar16 >> 6] &
       (-2L << bVar13 | 0xfffffffffffffffeU >> 0x40 - bVar13);
  sVar16 = *currentLoop;
  pbVar3 = (this->functionsPerLoop).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  memcpy(&loopFunctions.super__Base_bitset<24UL>,prodAgg,0xc0);
  std::_Base_bitset<24UL>::_M_do_and
            (&loopFunctions.super__Base_bitset<24UL>,&pbVar3[sVar16].super__Base_bitset<24UL>);
  bVar15 = std::_Base_bitset<24UL>::_M_is_any(&loopFunctions.super__Base_bitset<24UL>);
  if (bVar15) {
    iVar17 = std::
             _Hashtable<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&(this->localProductMap).
                     super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[*currentLoop]._M_h,&loopFunctions);
    if (iVar17.super__Node_iterator_base<std::pair<const_std::bitset<1500UL>,_unsigned_long>,_false>
        ._M_cur == (__node_type *)0x0) {
      sVar16 = *currentLoop;
      pvVar4 = (this->localProductList).
               super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = *(long *)&pvVar4[sVar16].
                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                        ._M_impl.super__Vector_impl_data;
      pbVar3 = *(pointer *)
                ((long)&pvVar4[sVar16].
                        super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>
                        ._M_impl.super__Vector_impl_data + 8);
      pmVar18 = std::__detail::
                _Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<std::bitset<1500UL>,_std::pair<const_std::bitset<1500UL>,_unsigned_long>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::bitset<1500UL>_>,_std::hash<std::bitset<1500UL>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)((this->localProductMap).
                                 super__Vector_base<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>,_std::allocator<std::unordered_map<std::bitset<1500UL>,_unsigned_long,_std::hash<std::bitset<1500UL>_>,_std::equal_to<std::bitset<1500UL>_>,_std::allocator<std::pair<const_std::bitset<1500UL>,_unsigned_long>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + sVar16),&loopFunctions)
      ;
      *pmVar18 = ((long)pbVar3 - lVar9) / 0xc0;
      std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::push_back
                ((this->localProductList).
                 super__Vector_base<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>,_std::allocator<std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + *currentLoop,&loopFunctions);
      local_218 = 1;
    }
    else {
      local_218 = 1;
    }
  }
  else {
    local_218 = 0;
  }
  if ((prodAgg->viewAggregate).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (prodAgg->viewAggregate).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    sVar19 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                       (&viewsForThisLoop);
    if (sVar19 < 2) {
      sVar19 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::count
                         (&viewsForThisLoop);
      if (sVar19 == 1) {
        sVar19 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                           (&viewsForThisLoop);
        for (ppVar25 = (prodAgg->viewAggregate).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            (ppVar25 !=
             (prodAgg->viewAggregate).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish && (ppVar25->first != sVar19));
            ppVar25 = ppVar25 + 1) {
        }
      }
    }
    else {
      viewReg.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      viewReg.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      viewReg.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      sVar19 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_first
                         (&viewsForThisLoop);
      for (; sVar19 != 0xffffffffffffffff;
          sVar19 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::find_next
                             ((this->viewsPerLoop).
                              super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + *currentLoop,sVar19)) {
        for (ppVar25 = (prodAgg->viewAggregate).
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            ppVar25 !=
            (prodAgg->viewAggregate).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; ppVar25 = ppVar25 + 1) {
          if (ppVar25->first == sVar19) {
            std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::push_back(&viewReg,ppVar25);
            break;
          }
        }
      }
      iVar20 = std::
               _Rb_tree<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
               ::find(&(this->viewProductMap).
                       super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[*currentLoop]._M_t,&viewReg);
      sVar16 = *currentLoop;
      pmVar5 = (this->viewProductMap).
               super__Vector_base<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>,_std::allocator<std::map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (iVar20._M_node == &pmVar5[sVar16]._M_t._M_impl.super__Rb_tree_header._M_header) {
        pvVar6 = (this->viewProductList).
                 super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)&pvVar6[sVar16].
                          super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data;
        pvVar7 = *(pointer *)
                  ((long)&pvVar6[sVar16].
                          super__Vector_base<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
                          ._M_impl.super__Vector_impl_data + 8);
        pmVar21 = std::
                  map<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long,_std::less<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<std::pair<const_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_unsigned_long>_>_>
                  ::operator[](pmVar5 + sVar16,&viewReg);
        *pmVar21 = ((long)pvVar7 - lVar9) / 0x18;
        std::
        vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
        ::push_back((this->viewProductList).
                    super__Vector_base<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>,_std::allocator<std::vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + *currentLoop,&viewReg);
      }
      std::
      _Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ::~_Vector_base(&viewReg.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     );
    }
  }
  pVar14.second = 0;
  pVar14.first = (long)(this->listOfLoops).
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->listOfLoops).
                       super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
  uVar26 = 0;
  while( true ) {
    pvVar8 = (this->nextLoopsPerLoop).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar9 = *(long *)&pvVar8[sVar2].
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data;
    if ((ulong)((long)*(pointer *)
                       ((long)&pvVar8[sVar2].
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data + 8) - lVar9 >> 3) <= uVar26) {
      viewReg.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT71(viewReg.
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,local_218);
      viewReg.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)(this->listOfLoops).
                           super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->listOfLoops).
                           super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
      viewReg.
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bVar15 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::none(this_00);
      if ((bVar15) && (uVar26 = (prodAgg->previous).first, uVar26 < *maxDepth)) {
        puVar1 = (undefined8 *)
                 (*(long *)&(this->productToVariableRegister).
                            super__Vector_base<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>,_std::allocator<std::vector<ProductAggregate,_std::allocator<ProductAggregate>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar26].
                            super__Vector_base<ProductAggregate,_std::allocator<ProductAggregate>_>.
                            _M_impl.super__Vector_impl_data + 0xe8 +
                 (prodAgg->previous).second * 0x100);
        viewReg.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
        viewReg.
        super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
      }
      iVar22 = std::
               _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find(&(this->aggregateRegisterMap).
                       super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[sVar2]._M_h,(key_type *)&viewReg);
      if (iVar22.super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>._M_cur
          == (__node_type *)0x0) {
        pvVar11 = (this->newAggregateRegister).
                  super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)&pvVar11[sVar2].
                          super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                          super__Vector_impl_data;
        pAVar12 = *(pointer *)
                   ((long)&pvVar11[sVar2].
                           super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                           super__Vector_impl_data + 8);
        pmVar23 = std::__detail::
                  _Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)((this->aggregateRegisterMap).
                                   super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start + sVar2),
                               (key_type *)&viewReg);
        mVar24 = ((long)pAVar12 - lVar9) / 0x70;
        *pmVar23 = mVar24;
        std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::push_back
                  ((this->newAggregateRegister).
                   super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + sVar2,(value_type *)&viewReg);
      }
      else {
        mVar24 = *(mapped_type *)
                  ((long)iVar22.
                         super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>
                         ._M_cur + 0x78);
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&viewsForThisLoop);
      pVar28.second = mVar24;
      pVar28.first = sVar2;
      return pVar28;
    }
    uVar10 = *(unsigned_long *)(lVar9 + uVar26 * 8);
    nextLoop = uVar10;
    boost::operator&((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&viewReg,
                     (this->listOfLoops).
                     super__Vector_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar10,this_00);
    bVar15 = boost::operator!=((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &viewReg,this_00);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&viewReg);
    if (bVar15) break;
    memcpy((dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *)&viewReg,
           (this->functionsPerLoopBranch).
           super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>._M_impl.
           super__Vector_impl_data._M_start + uVar10,0xc0);
    std::_Base_bitset<24UL>::_M_do_and((_Base_bitset<24UL> *)&viewReg,(_Base_bitset<24UL> *)prodAgg)
    ;
    bVar15 = std::_Base_bitset<24UL>::_M_is_any((_Base_bitset<24UL> *)&viewReg);
    pVar27 = pVar14;
    if (bVar15) {
      pVar27 = addProductToLoop(this,prodAgg,&nextLoop,loopsOverRelation,maxDepth);
      pvVar8 = (this->nextLoopsPerLoop).
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = *(long *)&pvVar8[sVar2].
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data;
      if (uVar26 + 1 !=
          (long)*(pointer *)
                 ((long)&pvVar8[sVar2].
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data + 8) - lVar9 >> 3) {
        memcpy((key_type *)&viewReg,
               (this->functionsPerLoopBranch).
               super__Vector_base<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>.
               _M_impl.super__Vector_impl_data._M_start + *(long *)(lVar9 + 8 + uVar26 * 8),0xc0);
        std::_Base_bitset<24UL>::_M_do_and
                  ((_Base_bitset<24UL> *)&viewReg,(_Base_bitset<24UL> *)prodAgg);
        bVar15 = std::_Base_bitset<24UL>::_M_is_any((_Base_bitset<24UL> *)&viewReg);
        if (bVar15) {
          viewReg.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)viewReg.
                                super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage &
                        0xffffffffffffff00);
          viewReg.
          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._0_16_ = pVar14;
          iVar22 = std::
                   _Hashtable<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(&(this->aggregateRegisterMap).
                           super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_h,
                          (key_type *)&viewReg);
          if (iVar22.super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>.
              _M_cur == (__node_type *)0x0) {
            pvVar11 = (this->newAggregateRegister).
                      super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar9 = *(long *)&pvVar11[uVar10].
                              super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl.
                              super__Vector_impl_data;
            pAVar12 = *(pointer *)
                       ((long)&pvVar11[uVar10].
                               super__Vector_base<AggRegTuple,_std::allocator<AggRegTuple>_>._M_impl
                               .super__Vector_impl_data + 8);
            pmVar23 = std::__detail::
                      _Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<AggRegTuple,_std::pair<const_AggRegTuple,_unsigned_long>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<AggRegTuple>,_AggRegTuple_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)((this->aggregateRegisterMap).
                                       super__Vector_base<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>,_std::allocator<std::unordered_map<AggRegTuple,_unsigned_long,_AggRegTuple_hash,_std::equal_to<AggRegTuple>,_std::allocator<std::pair<const_AggRegTuple,_unsigned_long>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start + uVar10),
                                   (key_type *)&viewReg);
            mVar24 = ((long)pAVar12 - lVar9) / 0x70;
            pVar27.second = mVar24;
            pVar27.first = uVar10;
            *pmVar23 = mVar24;
            std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>::push_back
                      ((this->newAggregateRegister).
                       super__Vector_base<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>,_std::allocator<std::vector<AggRegTuple,_std::allocator<AggRegTuple>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10,(value_type *)&viewReg);
          }
          else {
            pVar27.second =
                 *(unsigned_long *)
                  ((long)iVar22.
                         super__Node_iterator_base<std::pair<const_AggRegTuple,_unsigned_long>,_true>
                         ._M_cur + 0x78);
            pVar27.first = uVar10;
          }
        }
      }
    }
    uVar26 = uVar26 + 1;
    pVar14 = pVar27;
  }
  std::operator<<((ostream *)&std::cerr,"There is a problem with nextLoopsPerLoop\n");
  exit(1);
}

Assistant:

std::pair<size_t,size_t> CppGenerator::addProductToLoop(
    ProductAggregate& prodAgg, size_t& currentLoop, bool& loopsOverRelation,
    const size_t& maxDepth)
{
    const size_t thisLoopID = currentLoop;
    const dyn_bitset& thisLoop = listOfLoops[currentLoop];

    dyn_bitset viewsForThisLoop = viewsPerLoop[currentLoop];
    loopsOverRelation = viewsForThisLoop[_qc->numberOfViews()];
    
    viewsForThisLoop.reset(_qc->numberOfViews());
 
    std::pair<bool,size_t> regTupleProduct = {false,0};  

    // check if this product requires computation over this loop loopmask
    prod_bitset loopFunctions = prodAgg.product & functionsPerLoop[currentLoop];
    if (loopFunctions.any())
    {
        // This should be add to the loop not depth 
        auto proditerator = localProductMap[currentLoop].find(loopFunctions);
        if (proditerator != localProductMap[currentLoop].end())
        {
            // set this local product to the id given by the map
            regTupleProduct = {true, proditerator->second};
        }
        else
        {
            size_t nextID = localProductList[currentLoop].size();
            localProductMap[currentLoop][loopFunctions] = nextID;
            regTupleProduct = {true, nextID};
            localProductList[currentLoop].push_back(loopFunctions);
        }
    }

    bool newViewProduct = false;
    bool singleViewAgg = false;
    
    std::pair<size_t, size_t> regTupleView = {2147483647,2147483647};

    if (!prodAgg.viewAggregate.empty())
    {
        if (viewsForThisLoop.count() > 1)
        {
            newViewProduct = true;
       
            std::vector<std::pair<size_t, size_t>> viewReg;

            size_t viewID = viewsForThisLoop.find_first();
            while (viewID != boost::dynamic_bitset<>::npos)
            {
                for (const std::pair<size_t, size_t>& viewAgg : prodAgg.viewAggregate)
                {
                    if (viewAgg.first == viewID)
                    {
                        viewReg.push_back(viewAgg);
                        break;
                    }
                }

                viewID = viewsPerLoop[currentLoop].find_next(viewID);
            }
            auto viewit = viewProductMap[currentLoop].find(viewReg);
            if (viewit != viewProductMap[currentLoop].end())
            {
                // set this local product to the id given by the map
                regTupleView = {currentLoop, viewit->second};            
            }
            else
            {
                size_t nextID =  viewProductList[currentLoop].size();
                viewProductMap[currentLoop][viewReg] = nextID;
                regTupleView = {currentLoop, nextID};
                viewProductList[currentLoop].push_back(viewReg);
            }
        }
        else if (viewsForThisLoop.count() == 1)
        {
            // Inside a loop there would only be a single view agg, so we could avoid
            // explicitly materializing the view Agg and simply multiply directly with
            // the aggregate from the view - this could be captured in the aggregate
            // computation that captures both the local aggregate and the view Agg
            singleViewAgg = true;
        
            // reuse the simple aggregate from the corresponding view
            size_t viewID = viewsForThisLoop.find_first();

            for (const std::pair<size_t, size_t>& viewAgg : prodAgg.viewAggregate)
            {
                if (viewAgg.first == viewID)
                {
                    regTupleView = viewAgg;
                    break;
                }
            }

            /*************** PRINT OUT **************/
            // if (regTupleView.first == 2)
            // {
            //     std::cout << "################## " <<
            //         regTupleView.first << "  " << regTupleView.second << std::endl;
            // }
            /*************** PRINT OUT **************/

        }
    }
    
    
    std::pair<size_t,size_t> previousComputation = {listOfLoops.size(),0};
    
    for (size_t next=0; next < nextLoopsPerLoop[thisLoopID].size(); ++next)
    {
        size_t nextLoop = nextLoopsPerLoop[thisLoopID][next];

        if (((listOfLoops[nextLoop] & thisLoop) != thisLoop))
        {
            ERROR("There is a problem with nextLoopsPerLoop\n");
            exit(1);
        }
        
        if ((functionsPerLoopBranch[nextLoop] & prodAgg.product).any())
        {
            std::pair<size_t, size_t> postComputation =
                addProductToLoop(prodAgg, nextLoop, loopsOverRelation, maxDepth);
            
            if (next + 1 != nextLoopsPerLoop[thisLoopID].size() &&
                (functionsPerLoopBranch[nextLoopsPerLoop[thisLoopID][next+1]]&
                 prodAgg.product).any())
            {
                // Add this product to this loop with the 'prev'Computation
                AggRegTuple postRegTuple;
                postRegTuple.postLoopAgg = true;
                postRegTuple.previous = previousComputation; 
                postRegTuple.postLoop = postComputation;
                
                // TODO: add the aggregate to the register!!
                auto regit = aggregateRegisterMap[nextLoop].find(postRegTuple);
                if (regit != aggregateRegisterMap[nextLoop].end())
                {
                    previousComputation = {nextLoop,regit->second};
                }
                else
                {
                    // If so, add it to the aggregate register
                    size_t newID = newAggregateRegister[nextLoop].size();
                    aggregateRegisterMap[nextLoop][postRegTuple] = newID;
                    newAggregateRegister[nextLoop].push_back(postRegTuple);
                    
                    previousComputation =  {nextLoop,newID};
                }
            }
            else
            {
                previousComputation = postComputation;
            }
            
        }
    }
    
    // while(currentLoop < listOfLoops.size()-1)
    // {
    //     currentLoop++;
    //     if (((listOfLoops[currentLoop] & thisLoop) == thisLoop))
    //     {
    //         if ((functionsPerLoopBranch[currentLoop] & prodAgg.product).any())
    //         {
    //             std::pair<size_t, size_t> postComputation =
    //                 addProductToLoop(prodAgg,currentLoop,loopsOverRelation,maxDepth);
    //             /**************** PRINT OUT ******************/
    //             // std::cout << "HERE \n";
    //             // std::cout << listOfLoops[currentLoop] <<"  "<<thisLoop<<std::endl;
    //             /**************** PRINT OUT ******************/
    //             // Add this product to this loop with the 'prev'Computation
    //             AggRegTuple postRegTuple;
    //             postRegTuple.postLoopAgg = true;
    //             postRegTuple.localAgg = previousComputation; // TODO:TODO:TODO:
    //             postRegTuple.postLoop = postComputation;
    //             // TODO: add the aggregate to the register!!
    //             auto regit = aggregateRegisterMap[currentLoop].find(postRegTuple);
    //             if (regit != aggregateRegisterMap[currentLoop].end())
    //                 previousComputation = {currentLoop,regit->second};
    //             else
    //             {
    //                 // If so, add it to the aggregate register
    //                 size_t newID = newAggregateRegister[currentLoop].size();
    //                 aggregateRegisterMap[currentLoop][postRegTuple] = newID;
    //                 newAggregateRegister[currentLoop].push_back(postRegTuple); 
    //                 previousComputation =  {currentLoop,newID};;
    //             }
    //         }
    //     }
    //     else break;
    // }

    // Check if this product has already been computed, if not we add it to the list
    AggRegTuple regTuple;
    regTuple.product = regTupleProduct;
    regTuple.viewAgg = regTupleView;

    /********* PRINT OUT ********/
    // if (regTupleView.first == 2)
    // {
    //     std::cout << "###########/>>>>>>>>> " <<
    //         regTuple.viewAgg.first << "  " << regTuple.viewAgg.second << std::endl;
    // }
    /********* PRINT OUT ********/
           
    regTuple.newViewProduct = newViewProduct;
    regTuple.singleViewAgg = singleViewAgg;
    regTuple.postLoop = previousComputation;

    regTuple.previous = {listOfLoops.size(),0};
    regTuple.multiplyByCount = false;
    
    // Multiply by previous #computation -- if needed
    if (thisLoop.none())
    {
        if (prodAgg.previous.first < maxDepth)
        {            
            const ProductAggregate& prevProdAgg =
                productToVariableRegister[prodAgg.previous.first]
                [prodAgg.previous.second];
            regTuple.previous = prevProdAgg.correspondingLoopAgg;
            regTuple.prevDepth = prodAgg.previous.first;
        }
        // Mutliply by count if needed
        if (!loopsOverRelation && prodAgg.multiplyByCount)
            regTuple.multiplyByCount = true;
    }

    auto regit = aggregateRegisterMap[thisLoopID].find(regTuple);
    if (regit != aggregateRegisterMap[thisLoopID].end())
    {
        previousComputation = {thisLoopID,regit->second};
    }
    else
    {
        // If so, add it to the aggregate register
        size_t newID = newAggregateRegister[thisLoopID].size();
        aggregateRegisterMap[thisLoopID][regTuple] = newID;
        newAggregateRegister[thisLoopID].push_back(regTuple);
        
        previousComputation =  {thisLoopID,newID};
    }

    return previousComputation;
}